

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_LS.h
# Opt level: O0

void __thiscall fanuc_post_processor::generate_LS::left_command(generate_LS *this)

{
  int iVar1;
  size_type sVar2;
  ulong uVar3;
  string local_188;
  string local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  int local_14;
  generate_LS *pgStack_10;
  int i;
  generate_LS *this_local;
  
  iVar1 = this->line_cnt;
  pgStack_10 = this;
  sVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::size
                    (&this->pos_);
  this->line_cnt = (iVar1 - (int)sVar2) + 2;
  local_14 = 0;
  while( true ) {
    uVar3 = (ulong)local_14;
    sVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::size
                      (&this->pos_);
    if (sVar2 <= uVar3) break;
    std::__cxx11::to_string(&local_158,local_14 + 1 + this->line_cnt);
    std::operator+(&local_138,"\t",&local_158);
    std::operator+(&local_118,&local_138,":L");
    std::operator+(&local_f8,&local_118," P[");
    std::__cxx11::to_string(&local_188,local_14 + 1);
    std::operator+(&local_d8,&local_f8,&local_188);
    std::operator+(&local_b8,&local_d8,"] ");
    std::operator+(&local_98,&local_b8,&this->velocity_);
    std::operator+(&local_78,&local_98,"mm/sec ");
    std::operator+(&local_58,&local_78,&this->cnt_);
    std::operator+(&local_38,&local_58,";\n");
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    local_14 = local_14 + 1;
  }
  sVar2 = std::vector<std::array<double,_7UL>,_std::allocator<std::array<double,_7UL>_>_>::size
                    (&this->pos_);
  this->line_cnt = this->line_cnt + (int)sVar2;
  return;
}

Assistant:

void generate_LS::left_command() {
        line_cnt = line_cnt - pos_.size() + 2;
        for(int i = 0; i < pos_.size(); i++){
            program.append("\t"+std::to_string(i+line_cnt+1)+":L"+" P["+std::to_string(i+1)+"] "+velocity_+"mm/sec "+cnt_+";\n");

        }
        line_cnt += pos_.size();
    }